

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

void ImGui::TreePop(void)

{
  ImGuiID id;
  float nav_layer;
  bool bVar1;
  uint *puVar2;
  ImRect local_2c;
  uint local_1c;
  ImGuiWindow *pIStack_18;
  ImU32 tree_depth_mask;
  ImGuiWindow *window;
  ImGuiContext *g;
  
  window = (ImGuiWindow *)GImGui;
  pIStack_18 = GImGui->CurrentWindow;
  Unindent(0.0);
  (pIStack_18->DC).TreeDepth = (pIStack_18->DC).TreeDepth + -1;
  local_1c = 1 << ((byte)(pIStack_18->DC).TreeDepth & 0x1f);
  if ((((window[0x11].WorkRect.Min.y == 0.0) &&
       (*(ImGuiWindow **)&window[0x11].DC.CurrentTableIdx == pIStack_18)) &&
      (bVar1 = NavMoveRequestButNoResultYet(), bVar1)) &&
     ((((uint)window[0x11].OuterRectClipped.Max.x & 1) != 0 &&
      (((pIStack_18->DC).TreeJumpToParentOnPopMask & local_1c) != 0)))) {
    puVar2 = ImVector<unsigned_int>::back(&pIStack_18->IDStack);
    id = *puVar2;
    nav_layer = window[0x11].OuterRectClipped.Min.y;
    ImRect::ImRect(&local_2c);
    SetNavID(id,(ImGuiNavLayer)nav_layer,0,&local_2c);
    NavMoveRequestCancel();
  }
  (pIStack_18->DC).TreeJumpToParentOnPopMask =
       local_1c - 1 & (pIStack_18->DC).TreeJumpToParentOnPopMask;
  if ((pIStack_18->IDStack).Size < 2) {
    __assert_fail("window->IDStack.Size > 1",
                  "/workspace/llm4binary/github/license_c_cmakelists/Twinklebear[P]imgui-transfer-function/example/imgui/imgui_widgets.cpp"
                  ,0x17aa,"void ImGui::TreePop()");
  }
  PopID();
  return;
}

Assistant:

void ImGui::TreePop()
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;
    Unindent();

    window->DC.TreeDepth--;
    ImU32 tree_depth_mask = (1 << window->DC.TreeDepth);

    // Handle Left arrow to move to parent tree node (when ImGuiTreeNodeFlags_NavLeftJumpsBackHere is enabled)
    if (g.NavMoveDir == ImGuiDir_Left && g.NavWindow == window && NavMoveRequestButNoResultYet())
        if (g.NavIdIsAlive && (window->DC.TreeJumpToParentOnPopMask & tree_depth_mask))
        {
            SetNavID(window->IDStack.back(), g.NavLayer, 0, ImRect());
            NavMoveRequestCancel();
        }
    window->DC.TreeJumpToParentOnPopMask &= tree_depth_mask - 1;

    IM_ASSERT(window->IDStack.Size > 1); // There should always be 1 element in the IDStack (pushed during window creation). If this triggers you called TreePop/PopID too much.
    PopID();
}